

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.cc
# Opt level: O1

void __thiscall
testing::Matcher<std::basic_string_view<char,_std::char_traits<char>_>_>::Matcher
          (Matcher<std::basic_string_view<char,_std::char_traits<char>_>_> *this,string *s)

{
  pointer pcVar1;
  undefined1 *local_88;
  undefined8 local_80;
  undefined1 local_78;
  undefined7 uStack_77;
  undefined8 uStack_70;
  MatcherBase<std::basic_string_view<char,_std::char_traits<char>_>_> local_68;
  long *local_50;
  long local_48;
  long local_40 [2];
  
  (this->super_MatcherBase<std::basic_string_view<char,_std::char_traits<char>_>_>).vtable_ =
       (VTable *)0x0;
  (this->super_MatcherBase<std::basic_string_view<char,_std::char_traits<char>_>_>).
  super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_00171818;
  pcVar1 = (s->_M_dataplus)._M_p;
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char*>((string *)&local_50,pcVar1,pcVar1 + s->_M_string_length)
  ;
  local_88 = &local_78;
  std::__cxx11::string::_M_construct<char*>((string *)&local_88,local_50,local_48 + (long)local_50);
  local_68.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_00171b80;
  local_68.vtable_ =
       (VTable *)
       internal::MatcherBase<std::basic_string_view<char,std::char_traits<char>>>::
       GetVTable<testing::internal::MatcherBase<std::basic_string_view<char,std::char_traits<char>>>::ValuePolicy<testing::internal::EqMatcher<std::__cxx11::string>,false>>()
       ::kVTable;
  local_68.buffer_.ptr = operator_new(0x28);
  ((local_68.buffer_.shared)->ref).super___atomic_base<int>._M_i = 1;
  *(SharedPayloadBase **)(local_68.buffer_.i + 8) = (SharedPayloadBase *)(local_68.buffer_.i + 0x18)
  ;
  if (local_88 == &local_78) {
    *(ulong *)(local_68.buffer_.i + 0x18) = CONCAT71(uStack_77,local_78);
    *(undefined8 *)(local_68.buffer_.i + 0x20) = uStack_70;
  }
  else {
    *(undefined1 **)(local_68.buffer_.i + 8) = local_88;
    *(ulong *)(local_68.buffer_.i + 0x18) = CONCAT71(uStack_77,local_78);
  }
  *(undefined8 *)(local_68.buffer_.i + 0x10) = local_80;
  local_80 = 0;
  local_78 = 0;
  local_68.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_00171818;
  local_88 = &local_78;
  internal::MatcherBase<std::basic_string_view<char,_std::char_traits<char>_>_>::operator=
            (&this->super_MatcherBase<std::basic_string_view<char,_std::char_traits<char>_>_>,
             &local_68);
  local_68.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_00171b80;
  if ((local_68.vtable_ != (VTable *)0x0) &&
     ((local_68.vtable_)->shared_destroy != (_func_void_SharedPayloadBase_ptr *)0x0)) {
    LOCK();
    ((local_68.buffer_.shared)->ref).super___atomic_base<int>._M_i =
         ((local_68.buffer_.shared)->ref).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_68.buffer_.shared)->ref).super___atomic_base<int>._M_i == 0) {
      (*(local_68.vtable_)->shared_destroy)((SharedPayloadBase *)local_68.buffer_.ptr);
    }
  }
  if (local_88 != &local_78) {
    operator_delete(local_88,CONCAT71(uStack_77,local_78) + 1);
  }
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  return;
}

Assistant:

Matcher<internal::StringView>::Matcher(const std::string& s) { *this = Eq(s); }